

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOUAmount.cpp
# Opt level: O1

bool __thiscall jbcoin::IOUAmount::operator<(IOUAmount *this,IOUAmount *other)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = this->mantissa_;
  bVar3 = SUB81(uVar1 >> 0x3f,0);
  uVar2 = other->mantissa_;
  if (-1 < (long)(uVar2 ^ uVar1)) {
    if (uVar1 == 0) {
      return 0 < (long)uVar2;
    }
    if (uVar2 == 0) {
      return false;
    }
    if (this->exponent_ <= other->exponent_) {
      if (other->exponent_ <= this->exponent_) {
        return (long)uVar1 < (long)uVar2;
      }
      bVar3 = -1 < (long)uVar1;
    }
  }
  return bVar3;
}

Assistant:

bool
IOUAmount::operator<(IOUAmount const& other) const
{
    // If the two amounts have different signs (zero is treated as positive)
    // then the comparison is true iff the left is negative.
    bool const lneg = mantissa_ < 0;
    bool const rneg = other.mantissa_ < 0;

    if (lneg != rneg)
        return lneg;

    // Both have same sign and the left is zero: the right must be
    // greater than 0.
    if (mantissa_ == 0)
        return other.mantissa_ > 0;

    // Both have same sign, the right is zero and the left is non-zero.
    if (other.mantissa_ == 0)
        return false;

    // Both have the same sign, compare by exponents:
    if (exponent_ > other.exponent_)
        return lneg;
    if (exponent_ < other.exponent_)
        return !lneg;

    // If equal exponents, compare mantissas
    return mantissa_ < other.mantissa_;
}